

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  Curl_cfilter *cf;
  Curl_easy *data;
  ssl_peer *peer;
  
  cf = (Curl_cfilter *)SSL_get_ex_data((SSL *)ssl,0);
  if ((cf == (Curl_cfilter *)0x0) || (peer = (ssl_peer *)cf->ctx, peer == (ssl_peer *)0x0)) {
    peer = (ssl_peer *)0x0;
    data = (Curl_easy *)0x0;
  }
  else {
    data = (Curl_easy *)peer[1].sni;
  }
  Curl_ossl_add_session(cf,data,peer,ssl_sessionid);
  return 0;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  struct Curl_cfilter *cf;
  struct Curl_easy *data;
  struct ssl_connect_data *connssl;

  cf = (struct Curl_cfilter*) SSL_get_app_data(ssl);
  connssl = cf? cf->ctx : NULL;
  data = connssl? CF_DATA_CURRENT(cf) : NULL;
  Curl_ossl_add_session(cf, data, &connssl->peer, ssl_sessionid);
  return 0;
}